

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_improve_item_use_handling.hpp
# Opt level: O0

uint32_t PatchImproveItemUseHandling::inject_pre_use_table(ROM *rom,World *world)

{
  bool bVar1;
  uint8_t byte;
  uint32_t uVar2;
  map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
  *this;
  allocator<char> local_f1;
  string local_f0;
  type *local_d0;
  type *item;
  type *id;
  _Self local_b8;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
  *__range1;
  Code pre_use_table;
  World *world_local;
  ROM *rom_local;
  
  pre_use_table._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = (size_t)world;
  md::Code::Code((Code *)&__range1);
  this = World::items((World *)pre_use_table._labels._M_t._M_impl.super__Rb_tree_header.
                               _M_node_count);
  __end1 = std::
           map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
           ::begin(this);
  local_b8._M_node =
       (_Base_ptr)
       std::
       map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
       ::end(this);
  while (bVar1 = std::operator==(&__end1,&local_b8), ((bVar1 ^ 0xffU) & 1) != 0) {
    id = &std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_Item_*>_>::operator*(&__end1)
          ->first;
    item = (type *)std::get<0ul,unsigned_char_const,Item*>((pair<const_unsigned_char,_Item_*> *)id);
    local_d0 = std::get<1ul,unsigned_char_const,Item*>((pair<const_unsigned_char,_Item_*> *)id);
    uVar2 = Item::pre_use_address(*local_d0);
    if (uVar2 != 0) {
      uVar2 = Item::pre_use_address(*local_d0);
      md::Code::jmp((Code *)&__range1,uVar2);
      byte = Item::id(*local_d0);
      md::Code::add_byte((Code *)&__range1,byte);
      md::Code::add_byte((Code *)&__range1,0xff);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_char,_Item_*>_>::operator++(&__end1);
  }
  md::Code::nop((Code *)&__range1,3);
  md::Code::add_byte((Code *)&__range1,0xff);
  md::Code::add_byte((Code *)&__range1,0xff);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_f0,"",&local_f1);
  uVar2 = md::ROM::inject_code(rom,(Code *)&__range1,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::allocator<char>::~allocator(&local_f1);
  md::Code::~Code((Code *)&__range1);
  return uVar2;
}

Assistant:

static uint32_t inject_pre_use_table(md::ROM& rom, const World& world)
    {
        md::Code pre_use_table;
        for(auto& [id, item] : world.items())
        {
            if(!item->pre_use_address())
                continue;

            pre_use_table.jmp(item->pre_use_address());
            pre_use_table.add_byte(item->id());
            pre_use_table.add_byte(0xFF);
        }

        pre_use_table.nop(3);
        pre_use_table.add_byte(0xFF);
        pre_use_table.add_byte(0xFF);

        return rom.inject_code(pre_use_table);
    }